

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

Reader * __thiscall
capnp::TwoPartyVatNetwork::getPeerVatId(Reader *__return_storage_ptr__,TwoPartyVatNetwork *this)

{
  StructBuilder SStack_38;
  
  MessageBuilder::getRoot<capnp::rpc::twoparty::VatId>
            ((Builder *)&SStack_38,&(this->peerVatId).super_MessageBuilder);
  capnp::_::StructBuilder::asReader(&SStack_38);
  return __return_storage_ptr__;
}

Assistant:

rpc::twoparty::VatId::Reader TwoPartyVatNetwork::getPeerVatId() {
  return peerVatId.getRoot<rpc::twoparty::VatId>();
}